

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O3

UnlocalizedNumberFormatter * __thiscall
icu_63::number::NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::macros
          (UnlocalizedNumberFormatter *__return_storage_ptr__,
          NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter> *this,
          MacroProps *macros)

{
  SymbolsPointerType SVar1;
  PluralRules *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  UNumberSignDisplay UVar6;
  long lVar7;
  Precision *pPVar8;
  Precision *pPVar9;
  byte bVar10;
  
  bVar10 = 0;
  impl::MacroProps::MacroProps((MacroProps *)__return_storage_ptr__,&this->fMacros);
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.notation.fUnion.scientific.fExponentSignDisplay =
       (macros->notation).fUnion.scientific.fExponentSignDisplay;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.notation =
       *(undefined8 *)&macros->notation;
  MeasureUnit::operator=
            (&(__return_storage_ptr__->
              super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
              unit,&macros->unit);
  MeasureUnit::operator=
            (&(__return_storage_ptr__->
              super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
              perUnit,&macros->perUnit);
  pPVar8 = &macros->precision;
  pPVar9 = &(__return_storage_ptr__->
            super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
            precision;
  for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar5 = *(undefined4 *)&pPVar8->field_0x4;
    pPVar9->fType = pPVar8->fType;
    *(undefined4 *)&pPVar9->field_0x4 = uVar5;
    pPVar8 = (Precision *)((long)pPVar8 + ((ulong)bVar10 * -2 + 1) * 8);
    pPVar9 = (Precision *)((long)pPVar9 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.integerWidth.fHasError = (macros->integerWidth).fHasError;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
           integerWidth.fUnion + 4) = *(undefined4 *)((long)&(macros->integerWidth).fUnion + 4);
  if ((MacroProps *)__return_storage_ptr__ != macros) {
    impl::SymbolsWrapper::doCleanup
              (&(__return_storage_ptr__->
                super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
                symbols);
    SVar1 = (macros->symbols).fType;
    (__return_storage_ptr__->
    super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.symbols.fType
         = SVar1;
    if (SVar1 - SYMPTR_DFS < 2) {
      (__return_storage_ptr__->
      super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.symbols.
      fPtr = (macros->symbols).fPtr;
      (macros->symbols).fPtr.dfs = (DecimalFormatSymbols *)0x0;
    }
  }
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.decimal = macros->decimal;
  UVar6 = macros->sign;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.unitWidth = macros->unitWidth;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.sign = UVar6;
  Scale::operator=(&(__return_storage_ptr__->
                    super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                    fMacros.scale,&macros->scale);
  pPVar2 = macros->rules;
  uVar3 = *(undefined8 *)((long)&macros->rules + 4);
  uVar4 = *(undefined8 *)((long)&macros->currencySymbols + 4);
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.affixProvider = macros->affixProvider;
  (__return_storage_ptr__->super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>
  ).fMacros.rules = pPVar2;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.rules
   + 4) = uVar3;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).fMacros.
           currencySymbols + 4) = uVar4;
  Locale::operator=(&(__return_storage_ptr__->
                     super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>).
                     fMacros.locale,&macros->locale);
  return __return_storage_ptr__;
}

Assistant:

Derived NumberFormatterSettings<Derived>::macros(impl::MacroProps&& macros) const& {
    Derived copy(*this);
    copy.fMacros = std::move(macros);
    return copy;
}